

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol(DescriptorPool *this,string *symbol_name)

{
  bool bVar1;
  const_iterator cVar2;
  Type *pTVar3;
  FileDescriptor *pFVar4;
  MutexLockMaybe lock;
  MutexLockMaybe local_40;
  Symbol local_38;
  pointer local_28;
  
  internal::MutexLockMaybe::MutexLockMaybe(&local_40,this->mutex_);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_symbols_)._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_files_)._M_h);
  }
  local_28 = (symbol_name->_M_dataplus)._M_p;
  cVar2 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(((this->tables_)._M_t.
                    super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                   _M_head_impl)->symbols_by_name_)._M_h,&local_28);
  pTVar3 = (Type *)((long)cVar2.
                          super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                          ._M_cur + 0x10);
  if (cVar2.super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
      _M_cur == (__node_type *)0x0) {
    pTVar3 = &(anonymous_namespace)::kNullSymbol;
  }
  local_38.field_1 = *(anon_union_8_8_13f84498_for_Symbol_2 *)(pTVar3 + 2);
  local_38.type = *pTVar3;
  if (local_38.type == NULL_SYMBOL) {
    if ((this->underlay_ != (DescriptorPool *)0x0) &&
       (pFVar4 = FindFileContainingSymbol(this->underlay_,symbol_name),
       pFVar4 != (FileDescriptor *)0x0)) goto LAB_002d06c0;
    bVar1 = TryFindSymbolInFallbackDatabase(this,symbol_name);
    if (bVar1) {
      local_28 = (symbol_name->_M_dataplus)._M_p;
      cVar2 = std::
              _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(((this->tables_)._M_t.
                        super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                        .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                       _M_head_impl)->symbols_by_name_)._M_h,&local_28);
      pTVar3 = (Type *)((long)cVar2.
                              super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                              ._M_cur + 0x10);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
          _M_cur == (__node_type *)0x0) {
        pTVar3 = &(anonymous_namespace)::kNullSymbol;
      }
      local_38.field_1 = *(anon_union_8_8_13f84498_for_Symbol_2 *)(pTVar3 + 2);
      local_38.type = *pTVar3;
      if (local_38.type != NULL_SYMBOL) goto LAB_002d06b3;
    }
    pFVar4 = (FileDescriptor *)0x0;
  }
  else {
LAB_002d06b3:
    pFVar4 = Symbol::GetFile(&local_38);
  }
LAB_002d06c0:
  if ((pthread_mutex_t *)local_40.mu_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)local_40.mu_);
  }
  return pFVar4;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    const std::string& symbol_name) const {
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != nullptr) {
    const FileDescriptor* file_result =
        underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != nullptr) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return nullptr;
}